

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O1

void __thiscall cppnet::BlockMemoryPool::PoolLargeFree(BlockMemoryPool *this,void **m)

{
  pointer *pppvVar1;
  iterator __position;
  
  __position._M_current =
       (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
              ((vector<void*,std::allocator<void*>> *)&this->_free_mem_vec,__position,m);
  }
  else {
    *__position._M_current = *m;
    pppvVar1 = &(this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  if (0xa0 < (ulong)((long)(this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_start)) {
    (*this->_vptr_BlockMemoryPool[6])(this);
    return;
  }
  return;
}

Assistant:

void BlockMemoryPool::PoolLargeFree(void* &m) {
    bool release = false;
    {
#ifdef __use_iocp__
        std::lock_guard<std::mutex> lock(_mutex);
#endif
        _free_mem_vec.push_back(m);

        if (_free_mem_vec.size() > __max_block_num) {
            release = true;
        }
    }
    
    // release some block.
    if (release) {
        ReleaseHalf();
    }
}